

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall cmMakefileTargetGenerator::WriteTargetDependRules(cmMakefileTargetGenerator *this)

{
  cmLocalUnixMakefileGenerator3 *pcVar1;
  byte bVar2;
  bool bVar3;
  cmGeneratedFileStream *this_00;
  char *pcVar4;
  ostream *poVar5;
  pointer ppVar6;
  reference pbVar7;
  value_type local_590;
  string local_570;
  string local_550;
  allocator local_529;
  string local_528;
  string local_508;
  string local_4e8;
  allocator local_4c1;
  string local_4c0;
  string local_4a0;
  string local_480;
  allocator local_459;
  string local_458;
  string local_438;
  string local_418;
  allocator local_3f1;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390 [39];
  allocator local_369;
  string local_368;
  string local_348;
  string local_328;
  undefined1 local_308 [8];
  ostringstream depCmd;
  undefined1 local_190 [8];
  string depTarget;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  allocator local_119;
  string local_118;
  string *local_f8;
  string *working_dir;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e8;
  iterator i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  string local_a8;
  iterator local_88;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  iterator local_78;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  const_iterator pi;
  string local_60;
  string local_30 [8];
  string dir;
  cmMakefileTargetGenerator *this_local;
  
  dir.field_2._8_8_ = this;
  (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
    _vptr_cmLocalGenerator[0xc])
            (local_30,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  std::__cxx11::string::operator=((string *)&this->InfoFileNameFull,local_30);
  std::__cxx11::string::operator+=((string *)&this->InfoFileNameFull,"/DependInfo.cmake");
  cmLocalUnixMakefileGenerator3::ConvertToFullPath
            (&local_60,this->LocalGenerator,&this->InfoFileNameFull);
  std::__cxx11::string::operator=((string *)&this->InfoFileNameFull,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  this_00 = (cmGeneratedFileStream *)operator_new(0x248);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmGeneratedFileStream::cmGeneratedFileStream(this_00,pcVar4,false,None);
  this->InfoFileStream = this_00;
  cmGeneratedFileStream::SetCopyIfDifferent(this->InfoFileStream,true);
  bVar2 = std::ios::operator!((ios *)((long)&(this->InfoFileStream->super_ofstream).
                                             super_basic_ostream<char,_std::char_traits<char>_>.
                                             _vptr_basic_ostream +
                                     (long)(this->InfoFileStream->super_ofstream).
                                           super_basic_ostream<char,_std::char_traits<char>_>.
                                           _vptr_basic_ostream[-3]));
  if ((bVar2 & 1) == 0) {
    cmLocalUnixMakefileGenerator3::WriteDependLanguageInfo
              (this->LocalGenerator,(ostream *)this->InfoFileStream,
               (this->super_cmCommonTargetGenerator).GeneratorTarget);
    bVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::empty(&this->MultipleOutputPairs);
    if (!bVar3) {
      poVar5 = std::operator<<((ostream *)this->InfoFileStream,"\n");
      poVar5 = std::operator<<(poVar5,"# Pairs of files generated by the same build rule.\n");
      std::operator<<(poVar5,"set(CMAKE_MULTIPLE_OUTPUT_PAIRS\n");
      local_78._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(&this->MultipleOutputPairs);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_Rb_tree_const_iterator(&local_70,&local_78);
      while( true ) {
        local_88._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end(&this->MultipleOutputPairs);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_Rb_tree_const_iterator(&local_80,&local_88);
        bVar3 = std::operator!=(&local_70,&local_80);
        if (!bVar3) break;
        poVar5 = std::operator<<((ostream *)this->InfoFileStream,"  ");
        ppVar6 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->(&local_70);
        cmOutputConverter::EscapeForCMake(&local_a8,&ppVar6->first);
        poVar5 = std::operator<<(poVar5,(string *)&local_a8);
        poVar5 = std::operator<<(poVar5," ");
        ppVar6 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->(&local_70);
        cmOutputConverter::EscapeForCMake
                  ((string *)
                   &dirs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&ppVar6->second);
        poVar5 = std::operator<<(poVar5,(string *)
                                        &dirs.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::operator<<(poVar5,"\n");
        std::__cxx11::string::~string
                  ((string *)
                   &dirs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string((string *)&local_a8);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator++(&local_70);
      }
      std::operator<<((ostream *)this->InfoFileStream,"  )\n\n");
    }
    poVar5 = std::operator<<((ostream *)this->InfoFileStream,"\n");
    poVar5 = std::operator<<(poVar5,"# Targets to which this target links.\n");
    std::operator<<(poVar5,"set(CMAKE_TARGET_LINKED_INFO_FILES\n");
    cmCommonTargetGenerator::GetLinkedTargetDirectories_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&i,&this->super_cmCommonTargetGenerator);
    local_e8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&i);
    while( true ) {
      working_dir = (string *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&i);
      bVar3 = __gnu_cxx::operator!=
                        (&local_e8,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&working_dir);
      if (!bVar3) break;
      poVar5 = std::operator<<((ostream *)this->InfoFileStream,"  \"");
      pbVar7 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_e8);
      poVar5 = std::operator<<(poVar5,(string *)pbVar7);
      std::operator<<(poVar5,"/DependInfo.cmake\"\n");
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_e8);
    }
    std::operator<<((ostream *)this->InfoFileStream,"  )\n");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&i);
    pcVar4 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this->LocalGenerator);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_118,pcVar4,&local_119);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
    local_f8 = &local_118;
    poVar5 = std::operator<<((ostream *)this->InfoFileStream,"\n");
    poVar5 = std::operator<<(poVar5,"# Fortran module output directory.\n");
    poVar5 = std::operator<<(poVar5,"set(CMAKE_Fortran_TARGET_MODULE_DIR \"");
    cmGeneratorTarget::GetFortranModuleDirectory
              ((string *)
               &depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (this->super_cmCommonTargetGenerator).GeneratorTarget,local_f8);
    poVar5 = std::operator<<(poVar5,(string *)
                                    &depends.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::operator<<(poVar5,"\")\n");
    std::__cxx11::string::~string
              ((string *)
               &depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&commands.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&depTarget.field_2 + 8));
    cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
              ((string *)local_190,this->LocalGenerator,
               (this->super_cmCommonTargetGenerator).GeneratorTarget);
    std::__cxx11::string::operator+=((string *)local_190,"/depend");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
    poVar5 = std::operator<<((ostream *)local_308,"cd ");
    pcVar1 = this->LocalGenerator;
    pcVar4 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)pcVar1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_368,pcVar4,&local_369);
    cmsys::SystemTools::CollapseFullPath(&local_348,&local_368);
    cmOutputConverter::ConvertToOutputFormat
              (&local_328,
               &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_348,SHELL);
    poVar5 = std::operator<<(poVar5,(string *)&local_328);
    std::operator<<(poVar5," && ");
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_368);
    std::allocator<char>::~allocator((allocator<char> *)&local_369);
    poVar5 = std::operator<<((ostream *)local_308,"$(CMAKE_COMMAND) -E cmake_depends \"");
    (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
      _vptr_cmGlobalGenerator[3])(local_390);
    poVar5 = std::operator<<(poVar5,local_390);
    poVar5 = std::operator<<(poVar5,"\" ");
    pcVar1 = this->LocalGenerator;
    pcVar4 = cmLocalGenerator::GetSourceDirectory((cmLocalGenerator *)pcVar1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3f0,pcVar4,&local_3f1);
    cmsys::SystemTools::CollapseFullPath(&local_3d0,&local_3f0);
    cmOutputConverter::ConvertToOutputFormat
              (&local_3b0,
               &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_3d0,SHELL);
    poVar5 = std::operator<<(poVar5,(string *)&local_3b0);
    poVar5 = std::operator<<(poVar5," ");
    pcVar1 = this->LocalGenerator;
    pcVar4 = cmLocalGenerator::GetCurrentSourceDirectory((cmLocalGenerator *)pcVar1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_458,pcVar4,&local_459);
    cmsys::SystemTools::CollapseFullPath(&local_438,&local_458);
    cmOutputConverter::ConvertToOutputFormat
              (&local_418,
               &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_438,SHELL);
    poVar5 = std::operator<<(poVar5,(string *)&local_418);
    poVar5 = std::operator<<(poVar5," ");
    pcVar1 = this->LocalGenerator;
    pcVar4 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)pcVar1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4c0,pcVar4,&local_4c1);
    cmsys::SystemTools::CollapseFullPath(&local_4a0,&local_4c0);
    cmOutputConverter::ConvertToOutputFormat
              (&local_480,
               &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_4a0,SHELL);
    poVar5 = std::operator<<(poVar5,(string *)&local_480);
    poVar5 = std::operator<<(poVar5," ");
    pcVar1 = this->LocalGenerator;
    pcVar4 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)pcVar1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_528,pcVar4,&local_529);
    cmsys::SystemTools::CollapseFullPath(&local_508,&local_528);
    cmOutputConverter::ConvertToOutputFormat
              (&local_4e8,
               &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_508,SHELL);
    poVar5 = std::operator<<(poVar5,(string *)&local_4e8);
    poVar5 = std::operator<<(poVar5," ");
    pcVar1 = this->LocalGenerator;
    cmsys::SystemTools::CollapseFullPath(&local_570,&this->InfoFileNameFull);
    cmOutputConverter::ConvertToOutputFormat
              (&local_550,
               &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_570,SHELL);
    std::operator<<(poVar5,(string *)&local_550);
    std::__cxx11::string::~string((string *)&local_550);
    std::__cxx11::string::~string((string *)&local_570);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::~string((string *)&local_508);
    std::__cxx11::string::~string((string *)&local_528);
    std::allocator<char>::~allocator((allocator<char> *)&local_529);
    std::__cxx11::string::~string((string *)&local_480);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
    std::__cxx11::string::~string((string *)&local_418);
    std::__cxx11::string::~string((string *)&local_438);
    std::__cxx11::string::~string((string *)&local_458);
    std::allocator<char>::~allocator((allocator<char> *)&local_459);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
    std::__cxx11::string::~string(local_390);
    bVar3 = cmLocalUnixMakefileGenerator3::GetColorMakefile(this->LocalGenerator);
    if (bVar3) {
      std::operator<<((ostream *)local_308," --color=$(COLOR)");
    }
    std::__cxx11::ostringstream::str();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&depTarget.field_2 + 8),&local_590);
    std::__cxx11::string::~string((string *)&local_590);
    if (this->CustomCommandDriver == OnDepends) {
      DriveCustomCommands(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&commands.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    cmLocalUnixMakefileGenerator3::WriteMakeRule
              (this->LocalGenerator,(ostream *)this->BuildFileStream,(char *)0x0,(string *)local_190
               ,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&commands.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&depTarget.field_2 + 8),true,false);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
    std::__cxx11::string::~string((string *)local_190);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&depTarget.field_2 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&commands.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_118);
    pi._M_node._4_4_ = 0;
  }
  else {
    pi._M_node._4_4_ = 1;
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteTargetDependRules()
{
  // must write the targets depend info file
  std::string dir =
    this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget);
  this->InfoFileNameFull = dir;
  this->InfoFileNameFull += "/DependInfo.cmake";
  this->InfoFileNameFull =
    this->LocalGenerator->ConvertToFullPath(this->InfoFileNameFull);
  this->InfoFileStream =
    new cmGeneratedFileStream(this->InfoFileNameFull.c_str());
  this->InfoFileStream->SetCopyIfDifferent(true);
  if (!*this->InfoFileStream) {
    return;
  }
  this->LocalGenerator->WriteDependLanguageInfo(*this->InfoFileStream,
                                                this->GeneratorTarget);

  // Store multiple output pairs in the depend info file.
  if (!this->MultipleOutputPairs.empty()) {
    /* clang-format off */
    *this->InfoFileStream
      << "\n"
      << "# Pairs of files generated by the same build rule.\n"
      << "set(CMAKE_MULTIPLE_OUTPUT_PAIRS\n";
    /* clang-format on */
    for (MultipleOutputPairsType::const_iterator pi =
           this->MultipleOutputPairs.begin();
         pi != this->MultipleOutputPairs.end(); ++pi) {
      *this->InfoFileStream
        << "  " << cmOutputConverter::EscapeForCMake(pi->first) << " "
        << cmOutputConverter::EscapeForCMake(pi->second) << "\n";
    }
    *this->InfoFileStream << "  )\n\n";
  }

  // Store list of targets linked directly or transitively.
  {
    /* clang-format off */
  *this->InfoFileStream
    << "\n"
    << "# Targets to which this target links.\n"
    << "set(CMAKE_TARGET_LINKED_INFO_FILES\n";
    /* clang-format on */
    std::vector<std::string> dirs = this->GetLinkedTargetDirectories();
    for (std::vector<std::string>::iterator i = dirs.begin(); i != dirs.end();
         ++i) {
      *this->InfoFileStream << "  \"" << *i << "/DependInfo.cmake\"\n";
    }
    *this->InfoFileStream << "  )\n";
  }

  std::string const& working_dir =
    this->LocalGenerator->GetCurrentBinaryDirectory();

  /* clang-format off */
  *this->InfoFileStream
    << "\n"
    << "# Fortran module output directory.\n"
    << "set(CMAKE_Fortran_TARGET_MODULE_DIR \""
    << this->GeneratorTarget->GetFortranModuleDirectory(working_dir)
    << "\")\n";
  /* clang-format on */

  // and now write the rule to use it
  std::vector<std::string> depends;
  std::vector<std::string> commands;

  // Construct the name of the dependency generation target.
  std::string depTarget =
    this->LocalGenerator->GetRelativeTargetDirectory(this->GeneratorTarget);
  depTarget += "/depend";

  // Add a command to call CMake to scan dependencies.  CMake will
  // touch the corresponding depends file after scanning dependencies.
  std::ostringstream depCmd;
// TODO: Account for source file properties and directory-level
// definitions when scanning for dependencies.
#if !defined(_WIN32) || defined(__CYGWIN__)
  // This platform supports symlinks, so cmSystemTools will translate
  // paths.  Make sure PWD is set to the original name of the home
  // output directory to help cmSystemTools to create the same
  // translation table for the dependency scanning process.
  depCmd << "cd " << (this->LocalGenerator->ConvertToOutputFormat(
                       cmSystemTools::CollapseFullPath(
                         this->LocalGenerator->GetBinaryDirectory()),
                       cmOutputConverter::SHELL))
         << " && ";
#endif
  // Generate a call this signature:
  //
  //   cmake -E cmake_depends <generator>
  //                          <home-src-dir> <start-src-dir>
  //                          <home-out-dir> <start-out-dir>
  //                          <dep-info> --color=$(COLOR)
  //
  // This gives the dependency scanner enough information to recreate
  // the state of our local generator sufficiently for its needs.
  depCmd << "$(CMAKE_COMMAND) -E cmake_depends \""
         << this->GlobalGenerator->GetName() << "\" "
         << this->LocalGenerator->ConvertToOutputFormat(
              cmSystemTools::CollapseFullPath(
                this->LocalGenerator->GetSourceDirectory()),
              cmOutputConverter::SHELL)
         << " "
         << this->LocalGenerator->ConvertToOutputFormat(
              cmSystemTools::CollapseFullPath(
                this->LocalGenerator->GetCurrentSourceDirectory()),
              cmOutputConverter::SHELL)
         << " "
         << this->LocalGenerator->ConvertToOutputFormat(
              cmSystemTools::CollapseFullPath(
                this->LocalGenerator->GetBinaryDirectory()),
              cmOutputConverter::SHELL)
         << " "
         << this->LocalGenerator->ConvertToOutputFormat(
              cmSystemTools::CollapseFullPath(
                this->LocalGenerator->GetCurrentBinaryDirectory()),
              cmOutputConverter::SHELL)
         << " "
         << this->LocalGenerator->ConvertToOutputFormat(
              cmSystemTools::CollapseFullPath(this->InfoFileNameFull),
              cmOutputConverter::SHELL);
  if (this->LocalGenerator->GetColorMakefile()) {
    depCmd << " --color=$(COLOR)";
  }
  commands.push_back(depCmd.str());

  // Make sure all custom command outputs in this target are built.
  if (this->CustomCommandDriver == OnDepends) {
    this->DriveCustomCommands(depends);
  }

  // Write the rule.
  this->LocalGenerator->WriteMakeRule(*this->BuildFileStream, CM_NULLPTR,
                                      depTarget, depends, commands, true);
}